

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QNetworkCookie>::pop_back(QList<QNetworkCookie> *this)

{
  qsizetype *pqVar1;
  Data *pDVar2;
  
  pDVar2 = (this->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QNetworkCookie>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QNetworkCookie> *)0x0);
  }
  QNetworkCookie::~QNetworkCookie((this->d).ptr + (this->d).size + -1);
  pqVar1 = &(this->d).size;
  *pqVar1 = *pqVar1 + -1;
  return;
}

Assistant:

void pop_back() noexcept { removeLast(); }